

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

bool duckdb_re2::IsAnchorStart(Regexp **pre,int depth)

{
  uint8_t uVar1;
  ushort uVar2;
  Regexp *this;
  bool bVar3;
  Regexp **sub_00;
  ulong uVar4;
  Regexp *pRVar5;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar6;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar7;
  ulong uVar8;
  Regexp *sub;
  new_allocator<duckdb_re2::Regexp_*> local_39;
  Regexp *local_38;
  
  this = *pre;
  if (3 < depth || this == (Regexp *)0x0) goto LAB_011e7a51;
  uVar1 = this->op_;
  if (uVar1 == '\x12') {
    pRVar5 = Regexp::LiteralString((Rune *)0x0,0,(uint)this->parse_flags_);
LAB_011e7b76:
    *pre = pRVar5;
    Regexp::Decref(this);
LAB_011e7b81:
    bVar3 = true;
  }
  else {
    if (uVar1 == '\v') {
      if (this->nsub_ < 2) {
        paVar6 = &this->field_5;
      }
      else {
        paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      local_38 = Regexp::Incref(paVar6->subone_);
      bVar3 = IsAnchorStart(&local_38,depth + 1);
      if (bVar3) {
        pRVar5 = Regexp::Capture(local_38,(uint)this->parse_flags_,(this->arguments).repeat.max_);
        goto LAB_011e7b76;
      }
LAB_011e7b97:
      Regexp::Decref(local_38);
    }
    else if ((uVar1 == '\x05') && (this->nsub_ != 0)) {
      paVar6 = &this->field_5;
      paVar7 = paVar6;
      if (this->nsub_ != 1) {
        paVar7 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      local_38 = Regexp::Incref(paVar7->subone_);
      bVar3 = IsAnchorStart(&local_38,depth + 1);
      if (!bVar3) goto LAB_011e7b97;
      sub_00 = __gnu_cxx::new_allocator<duckdb_re2::Regexp_*>::allocate
                         (&local_39,(ulong)this->nsub_,(void *)0x0);
      *sub_00 = local_38;
      uVar2 = this->nsub_;
      uVar4 = (ulong)uVar2;
      if (1 < uVar2) {
        uVar8 = 1;
        do {
          paVar7 = paVar6;
          if (1 < (ushort)uVar4) {
            paVar7 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)paVar6->submany_;
          }
          pRVar5 = Regexp::Incref(paVar7[uVar8].subone_);
          sub_00[uVar8] = pRVar5;
          uVar8 = uVar8 + 1;
          uVar2 = this->nsub_;
          uVar4 = (ulong)uVar2;
        } while (uVar8 < uVar4);
      }
      pRVar5 = Regexp::Concat(sub_00,(uint)uVar2,(uint)this->parse_flags_);
      *pre = pRVar5;
      Regexp::Decref(this);
      operator_delete(sub_00);
      goto LAB_011e7b81;
    }
LAB_011e7a51:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool IsAnchorStart(Regexp** pre, int depth) {
  Regexp* re = *pre;
  Regexp* sub;
  // The depth limit makes sure that we don't overflow
  // the stack on a deeply nested regexp.  As the comment
  // above says, IsAnchorStart is conservative, so returning
  // a false negative is okay.  The exact limit is somewhat arbitrary.
  if (re == NULL || depth >= 4)
    return false;
  switch (re->op()) {
    default:
      break;
    case kRegexpConcat:
      if (re->nsub() > 0) {
        sub = re->sub()[0]->Incref();
        if (IsAnchorStart(&sub, depth+1)) {
          PODArray<Regexp*> subcopy(re->nsub());
          subcopy[0] = sub;  // already have reference
          for (int i = 1; i < re->nsub(); i++)
            subcopy[i] = re->sub()[i]->Incref();
          *pre = Regexp::Concat(subcopy.data(), re->nsub(), re->parse_flags());
          re->Decref();
          return true;
        }
        sub->Decref();
      }
      break;
    case kRegexpCapture:
      sub = re->sub()[0]->Incref();
      if (IsAnchorStart(&sub, depth+1)) {
        *pre = Regexp::Capture(sub, re->parse_flags(), re->cap());
        re->Decref();
        return true;
      }
      sub->Decref();
      break;
    case kRegexpBeginText:
      *pre = Regexp::LiteralString(NULL, 0, re->parse_flags());
      re->Decref();
      return true;
  }
  return false;
}